

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_adapter.c
# Opt level: O1

size_t UNIT_conv_string_to_letter_utf8(char *s,MAFSA_letter *l,size_t sz_l)

{
  ulong uVar1;
  char cVar2;
  byte bVar3;
  u_char *i;
  
  cVar2 = *s;
  if (sz_l == 0 || cVar2 == '\0') {
    return 0;
  }
  uVar1 = 0;
  do {
    if (cVar2 == '\'') {
      bVar3 = 0x1b;
    }
    else if (cVar2 == '-') {
      bVar3 = 0x1a;
    }
    else {
      bVar3 = cVar2 + 0xbf;
      if ((0x19 < bVar3) && (bVar3 = cVar2 + 0x9f, 0x19 < bVar3)) {
        return uVar1;
      }
    }
    l[uVar1] = bVar3;
    cVar2 = s[uVar1 + 1];
    uVar1 = uVar1 + 1;
    if (cVar2 == '\0') {
      return uVar1;
    }
  } while (uVar1 < sz_l);
  return uVar1;
}

Assistant:

size_t UNIT_conv_string_to_letter_utf8(const char *s, MAFSA_letter *l, size_t sz_l)
{
    const u_char *i = (const u_char *) s;
    size_t pos = 0;
    while (*i && pos < sz_l)
    {
        if (i[0] == '\'')
        {
            l[pos] = UNIT_LETTER_APOSTROPHE;
        }
        else if (i[0] == '-')
        {
            l[pos] = UNIT_LETTER_DIFFIS;
        }
        else
        {
            if ((i[0] >= 'A') && (i[0] <= 'Z'))
            {
                l[pos] = (MAFSA_letter) (i[0] - 'A');
            }
            else if ((i[0] >= 'a') && (i[0] <= 'z'))
            {
                l[pos] = (MAFSA_letter) (i[0] - 'a');
            }
            else
            {
                return pos;
            }
        }
        ++i;
        ++pos;
    }
    return pos;
}